

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_doors.cpp
# Opt level: O1

void __thiscall DAnimatedDoor::Tick(DAnimatedDoor *this)

{
  int *piVar1;
  uint32_t *puVar2;
  FDoorAnimation *pFVar3;
  bool bVar4;
  FTextureID *pFVar5;
  int iVar6;
  int iVar7;
  line_t_conflict *plVar8;
  side_t *psVar9;
  
  pFVar3 = this->m_DoorAnim;
  if (pFVar3 == (FDoorAnimation *)0x0) goto LAB_003e9643;
  switch(this->m_Status) {
  case 0:
    piVar1 = &this->m_Timer;
    iVar6 = *piVar1;
    *piVar1 = *piVar1 + -1;
    if (iVar6 != 0) {
      return;
    }
    iVar6 = this->m_Frame;
    iVar7 = iVar6 + 1;
    this->m_Frame = iVar7;
    if (pFVar3->NumTextureFrames <= iVar7) {
      puVar2 = &this->m_Line1->flags;
      *puVar2 = *puVar2 & 0xfffffffe;
      puVar2 = &this->m_Line2->flags;
      *puVar2 = *puVar2 & 0xfffffffe;
      if (this->m_Delay != 0) {
        this->m_Timer = this->m_Delay;
        this->m_Status = 1;
        return;
      }
      goto switchD_003e9546_caseD_3;
    }
    this->m_Timer = this->m_Speed;
    plVar8 = this->m_Line1;
    psVar9 = plVar8->sidedef[0];
    pFVar5 = pFVar3->TextureFrames;
    iVar6 = pFVar5[(long)iVar6 + 1].texnum;
    break;
  case 1:
    piVar1 = &this->m_Timer;
    iVar6 = *piVar1;
    *piVar1 = *piVar1 + -1;
    if (iVar6 != 0) {
      return;
    }
    bVar4 = StartClosing(this);
    if (bVar4) {
      return;
    }
    this->m_Timer = this->m_Delay;
    return;
  case 2:
    piVar1 = &this->m_Timer;
    iVar6 = *piVar1;
    *piVar1 = *piVar1 + -1;
    if (iVar6 != 0) {
      return;
    }
    iVar6 = this->m_Frame;
    this->m_Frame = iVar6 + -1;
    if ((long)iVar6 < 1) {
      sector_t::MoveCeiling
                ((sector_t *)(this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,
                 2048.0,this->m_BotDist,-1,-1,false);
      (((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector)->ceilingdata).
      field_0.p = (DSectorEffect *)0x0;
      (*(this->super_DMovingCeiling).super_DMover.super_DSectorEffect.super_DThinker.super_DObject.
        _vptr_DObject[4])(this);
      if (this->m_SetBlocking1 == false) {
        puVar2 = &this->m_Line1->flags;
        *puVar2 = *puVar2 & 0xfffffffe;
      }
      if (this->m_SetBlocking2 != false) {
        return;
      }
      puVar2 = &this->m_Line2->flags;
      *puVar2 = *puVar2 & 0xfffffffe;
      return;
    }
    this->m_Timer = this->m_Speed;
    plVar8 = this->m_Line1;
    psVar9 = plVar8->sidedef[0];
    pFVar5 = pFVar3->TextureFrames;
    iVar6 = pFVar5[(long)iVar6 + -1].texnum;
    break;
  case 3:
switchD_003e9546_caseD_3:
    (((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector)->ceilingdata).field_0.
    p = (DSectorEffect *)0x0;
LAB_003e9643:
    (*(this->super_DMovingCeiling).super_DMover.super_DSectorEffect.super_DThinker.super_DObject.
      _vptr_DObject[4])(this);
    return;
  default:
    goto switchD_003e9546_default;
  }
  psVar9->textures[1].texture.texnum = iVar6;
  plVar8->sidedef[1]->textures[1].texture.texnum = pFVar5[this->m_Frame].texnum;
  plVar8 = this->m_Line2;
  plVar8->sidedef[0]->textures[1].texture.texnum = pFVar5[this->m_Frame].texnum;
  plVar8->sidedef[1]->textures[1].texture.texnum = pFVar5[this->m_Frame].texnum;
switchD_003e9546_default:
  return;
}

Assistant:

void DAnimatedDoor::Tick ()
{
	if (m_DoorAnim == NULL)
	{
		// can only happen when a bad savegame is loaded.
		Destroy();
		return;
	}

	switch (m_Status)
	{
	case Dead:
		m_Sector->ceilingdata = NULL;
		Destroy ();
		break;

	case Opening:
		if (!m_Timer--)
		{
			if (++m_Frame >= m_DoorAnim->NumTextureFrames)
			{
				// IF DOOR IS DONE OPENING...
				m_Line1->flags &= ~ML_BLOCKING;
				m_Line2->flags &= ~ML_BLOCKING;

				if (m_Delay == 0)
				{
					m_Sector->ceilingdata = NULL;
					Destroy ();
					break;
				}

				m_Timer = m_Delay;
				m_Status = Waiting;
			}
			else
			{
				// IF DOOR NEEDS TO ANIMATE TO NEXT FRAME...
				m_Timer = m_Speed;

				m_Line1->sidedef[0]->SetTexture(side_t::mid, m_DoorAnim->TextureFrames[m_Frame]);
				m_Line1->sidedef[1]->SetTexture(side_t::mid, m_DoorAnim->TextureFrames[m_Frame]);
				m_Line2->sidedef[0]->SetTexture(side_t::mid, m_DoorAnim->TextureFrames[m_Frame]);
				m_Line2->sidedef[1]->SetTexture(side_t::mid, m_DoorAnim->TextureFrames[m_Frame]);
			}
		}
		break;

	case Waiting:
		// IF DOOR IS DONE WAITING...
		if (!m_Timer--)
		{
			if (!StartClosing())
			{
				m_Timer = m_Delay;
			}
		}
		break;

	case Closing:
		if (!m_Timer--)
		{
			if (--m_Frame < 0)
			{
				// IF DOOR IS DONE CLOSING...
				m_Sector->MoveCeiling (2048., m_BotDist, -1);
				m_Sector->ceilingdata = NULL;
				Destroy ();
				// Unset blocking flags on lines that didn't start with them. Since the
				// ceiling is down now, we shouldn't need this flag anymore to keep things
				// from getting through.
				if (!m_SetBlocking1)
				{
					m_Line1->flags &= ~ML_BLOCKING;
				}
				if (!m_SetBlocking2)
				{
					m_Line2->flags &= ~ML_BLOCKING;
				}
				break;
			}
			else
			{
				// IF DOOR NEEDS TO ANIMATE TO NEXT FRAME...
				m_Timer = m_Speed;

				m_Line1->sidedef[0]->SetTexture(side_t::mid, m_DoorAnim->TextureFrames[m_Frame]);
				m_Line1->sidedef[1]->SetTexture(side_t::mid, m_DoorAnim->TextureFrames[m_Frame]);
				m_Line2->sidedef[0]->SetTexture(side_t::mid, m_DoorAnim->TextureFrames[m_Frame]);
				m_Line2->sidedef[1]->SetTexture(side_t::mid, m_DoorAnim->TextureFrames[m_Frame]);
			}
		}
		break;
	}
}